

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::
int_writer<long_long,_fmt::v6::basic_format_specs<char>_>::on_num
          (int_writer<long_long,_fmt::v6::basic_format_specs<char>_> *this)

{
  char *pcVar1;
  char cVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  num_writer f;
  char cVar6;
  int iVar7;
  int iVar8;
  _Alloc_hider _Var9;
  _Alloc_hider _Var10;
  uint uVar11;
  int num_digits;
  int iVar12;
  string_view prefix;
  string groups;
  undefined4 uStack_4c;
  undefined7 uStack_3f;
  string local_38;
  
  grouping_impl<char>(&local_38,(locale_ref)(this->writer->locale_).locale_);
  if (local_38._M_string_length == 0) {
    on_dec(this);
  }
  else {
    cVar6 = thousands_sep_impl<char>((locale_ref)(this->writer->locale_).locale_);
    if (cVar6 == '\0') {
      on_dec(this);
    }
    else {
      uVar3 = this->abs_value;
      lVar4 = 0x3f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      uVar11 = ((uint)lVar4 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
      iVar7 = uVar11 + (*(ulong *)(basic_data<void>::zero_or_powers_of_10_64 + (ulong)uVar11 * 8) <=
                       uVar3);
      pcVar1 = local_38._M_dataplus._M_p + local_38._M_string_length;
      _Var10._M_p = local_38._M_dataplus._M_p;
      iVar8 = iVar7;
      num_digits = iVar7;
      if (local_38._M_string_length != 0) {
        iVar5 = (int)local_38._M_string_length;
        _Var9._M_p = local_38._M_dataplus._M_p;
        do {
          cVar2 = *_Var9._M_p;
          iVar12 = iVar8 - cVar2;
          _Var10._M_p = _Var9._M_p;
          num_digits = iVar7;
          if ((iVar12 == 0 || iVar8 < cVar2) || ((byte)(cVar2 + 0x81U) < 0x82)) break;
          iVar7 = iVar7 + 1;
          _Var9._M_p = _Var9._M_p + 1;
          local_38._M_string_length = local_38._M_string_length - 1;
          _Var10._M_p = pcVar1;
          iVar8 = iVar12;
          num_digits = iVar5 + uVar11 + (*(ulong *)(basic_data<void>::zero_or_powers_of_10_64 +
                                                   (ulong)uVar11 * 8) <= uVar3);
        } while (local_38._M_string_length != 0);
      }
      if (_Var10._M_p == pcVar1) {
        num_digits = num_digits + (iVar8 + -1) / (int)pcVar1[-1];
      }
      f._12_4_ = uStack_4c;
      f.size = num_digits;
      f._25_7_ = uStack_3f;
      f.sep = cVar6;
      f.abs_value = uVar3;
      f.groups = &local_38;
      prefix.size_._0_4_ = this->prefix_size;
      prefix.data_ = this->prefix;
      prefix.size_._4_4_ = 0;
      basic_writer<fmt::v6::buffer_range<char>>::
      write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<long_long,fmt::v6::basic_format_specs<char>>::num_writer>
                ((basic_writer<fmt::v6::buffer_range<char>> *)this->writer,num_digits,prefix,
                 *this->specs,f);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = thousands_sep<char_type>(writer.locale_);
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, sep});
    }